

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O3

bool event_track::get_sparse_moov
               (string *urn,uint32_t timescale,uint32_t track_id,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *sparse_moov)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  base64_decode(&local_38,&moov_64_enc_abi_cxx11_);
  puVar1 = (sparse_moov->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (sparse_moov->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (sparse_moov->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (sparse_moov->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (sparse_moov->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  fmp4_stream::set_track_id(sparse_moov,track_id);
  puVar1 = (sparse_moov->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = timescale >> 0x18 | (timescale & 0xff0000) >> 8 | (timescale & 0xff00) << 8 |
          timescale << 0x18;
  *(uint *)(puVar1 + 0x1c) = uVar3;
  *(uint *)(puVar1 + 0xf4) = uVar3;
  *(uint32_t *)(puVar1 + 0x220) =
       track_id >> 0x18 | (track_id & 0xff0000) >> 8 | (track_id & 0xff00) << 8 | track_id << 0x18;
  set_evte(sparse_moov);
  return true;
}

Assistant:

bool event_track::get_sparse_moov(
	const std::string& urn, 
	uint32_t timescale, 
	uint32_t track_id, 
	std::vector<uint8_t> &sparse_moov)
{

	sparse_moov = base64_decode(moov_64_enc);
	set_track_id(sparse_moov, track_id);
	
	// write back the timescale mvhd
	fmp4_write_uint32(timescale, (char *)&sparse_moov[28]);

	// mdhd 
	fmp4_write_uint32(timescale, (char *)&sparse_moov[244]);

	// write back the timescale mvhd / mhd
	fmp4_write_uint32(track_id, (char*)&sparse_moov[544]);

	set_evte(sparse_moov);

	return true;
}